

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUtils.h
# Opt level: O0

void __thiscall
phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>::plot
          (TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID> *this,
          ofstream *OS)

{
  bool bVar1;
  ostream *poVar2;
  GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID> *pGVar3;
  string *psVar4;
  string local_148;
  string local_128;
  AddressID<phaeton::ExpressionNode> *local_108;
  AddressID<phaeton::ExpressionNode> *SuccId;
  AddressID<phaeton::ExpressionNode> *NId;
  GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID> *Succ;
  GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID> *N;
  string local_c8;
  AddressID<phaeton::ExpressionNode> *local_a8;
  AddressID<phaeton::ExpressionNode> *Target;
  AddressID<phaeton::ExpressionNode> *Src;
  StringID *Id_1;
  pair<const_phaeton::StringID,_phaeton::GraphEdge<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>
  *E;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  EdgeMap *__range2_1;
  string local_60;
  reference local_40;
  AddressID<phaeton::ExpressionNode> *Id;
  pair<const_phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>
  *N_1;
  const_iterator __end0;
  const_iterator __begin0;
  NodeMap *__range2;
  ofstream *OS_local;
  TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID> *this_local;
  
  poVar2 = std::operator<<((ostream *)OS,"digraph <");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
  std::operator<<(poVar2,"> {\n");
  __end0 = std::
           map<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_std::less<phaeton::AddressID<phaeton::ExpressionNode>_>,_std::allocator<std::pair<const_phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>_>_>
           ::begin(&this->Nodes);
  N_1 = (pair<const_phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>
         *)std::
           map<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_std::less<phaeton::AddressID<phaeton::ExpressionNode>_>,_std::allocator<std::pair<const_phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>_>_>
           ::end(&this->Nodes);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&N_1);
    if (!bVar1) break;
    local_40 = std::
               _Rb_tree_const_iterator<std::pair<const_phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>_>
               ::operator*(&__end0);
    Id = &local_40->first;
    poVar2 = std::operator<<((ostream *)OS,"\"");
    AddressID<phaeton::ExpressionNode>::str_abi_cxx11_(&local_60,&local_40->first);
    poVar2 = std::operator<<(poVar2,(string *)&local_60);
    poVar2 = std::operator<<(poVar2,"\"");
    poVar2 = std::operator<<(poVar2," [label=\"");
    psVar4 = GraphComponentID<phaeton::AddressID<phaeton::ExpressionNode>>::getLabel_abi_cxx11_
                       ((GraphComponentID<phaeton::AddressID<phaeton::ExpressionNode>> *)local_40);
    poVar2 = std::operator<<(poVar2,(string *)psVar4);
    std::operator<<(poVar2,"\"];\n");
    std::__cxx11::string::~string((string *)&local_60);
    std::
    _Rb_tree_const_iterator<std::pair<const_phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>_>
    ::operator++(&__end0);
  }
  __end0_1 = std::
             map<phaeton::StringID,_phaeton::GraphEdge<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_std::less<phaeton::StringID>,_std::allocator<std::pair<const_phaeton::StringID,_phaeton::GraphEdge<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>_>_>
             ::begin(&this->Edges);
  E = (pair<const_phaeton::StringID,_phaeton::GraphEdge<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>
       *)std::
         map<phaeton::StringID,_phaeton::GraphEdge<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_std::less<phaeton::StringID>,_std::allocator<std::pair<const_phaeton::StringID,_phaeton::GraphEdge<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>_>_>
         ::end(&this->Edges);
  while( true ) {
    bVar1 = std::operator!=(&__end0_1,(_Self *)&E);
    if (!bVar1) break;
    Src = (AddressID<phaeton::ExpressionNode> *)
          std::
          _Rb_tree_const_iterator<std::pair<const_phaeton::StringID,_phaeton::GraphEdge<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>_>
          ::operator*(&__end0_1);
    Id_1 = (StringID *)Src;
    pGVar3 = GraphEdge<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>::getSrcNode
                       (((reference)Src)->second);
    Target = GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>::getID
                       (pGVar3);
    pGVar3 = GraphEdge<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>::
             getTargetNode((GraphEdge<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>
                            *)Id_1[1].super_GraphComponentID<phaeton::StringID>.
                              super_Comparison<phaeton::StringID>._vptr_Comparison);
    local_a8 = GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>::getID
                         (pGVar3);
    poVar2 = std::operator<<((ostream *)OS,"\"");
    AddressID<phaeton::ExpressionNode>::str_abi_cxx11_(&local_c8,Target);
    poVar2 = std::operator<<(poVar2,(string *)&local_c8);
    poVar2 = std::operator<<(poVar2,"\" -> \"");
    AddressID<phaeton::ExpressionNode>::str_abi_cxx11_((string *)&N,local_a8);
    poVar2 = std::operator<<(poVar2,(string *)&N);
    poVar2 = std::operator<<(poVar2,"\"");
    poVar2 = std::operator<<(poVar2," [label=\"");
    psVar4 = GraphComponentID<phaeton::StringID>::getLabel_abi_cxx11_
                       ((GraphComponentID<phaeton::StringID> *)Src);
    poVar2 = std::operator<<(poVar2,(string *)psVar4);
    std::operator<<(poVar2,"\"];\n");
    std::__cxx11::string::~string((string *)&N);
    std::__cxx11::string::~string((string *)&local_c8);
    std::
    _Rb_tree_const_iterator<std::pair<const_phaeton::StringID,_phaeton::GraphEdge<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>_>
    ::operator++(&__end0_1);
  }
  Succ = getStartNode(this);
  while( true ) {
    bVar1 = GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>::hasSucc(Succ)
    ;
    if (!bVar1) break;
    NId = (AddressID<phaeton::ExpressionNode> *)
          GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>::getSucc(Succ);
    SuccId = GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>::getID(Succ);
    local_108 = GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>::getID
                          ((GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>
                            *)NId);
    poVar2 = std::operator<<((ostream *)OS,"\"");
    AddressID<phaeton::ExpressionNode>::str_abi_cxx11_(&local_128,SuccId);
    poVar2 = std::operator<<(poVar2,(string *)&local_128);
    poVar2 = std::operator<<(poVar2,"\" -> \"");
    AddressID<phaeton::ExpressionNode>::str_abi_cxx11_(&local_148,local_108);
    poVar2 = std::operator<<(poVar2,(string *)&local_148);
    poVar2 = std::operator<<(poVar2,"\"");
    std::operator<<(poVar2," [style=dashed];\n");
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_128);
    Succ = (GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID> *)NId;
  }
  std::operator<<((ostream *)OS,"}\n");
  return;
}

Assistant:

void TensorGraph<NodeID, EdgeID>::plot(std::ofstream &OS) const {
  OS << "digraph <" << this << "> {\n";

  for (const auto &N : Nodes) {
    const NodeID &Id = N.first;
    OS << "\"" << Id.str() << "\""
       << " [label=\"" << Id.getLabel() << "\"];\n";
  }

  for (const auto &E : Edges) {
    const EdgeID &Id = E.first;
    const NodeID &Src = E.second->getSrcNode()->getID();
    const NodeID &Target = E.second->getTargetNode()->getID();

    OS << "\"" << Src.str() << "\" -> \"" << Target.str() << "\""
       << " [label=\"" << Id.getLabel() << "\"];\n";
  }

  const GraphNode<NodeID, EdgeID> *N = getStartNode();
  while (N->hasSucc()) {
    const GraphNode<NodeID, EdgeID> *Succ = N->getSucc();
    const NodeID &NId = N->getID();
    const NodeID &SuccId = Succ->getID();

    OS << "\"" << NId.str() << "\" -> \"" << SuccId.str() << "\""
       << " [style=dashed];\n";

    N = Succ;
  }

  OS << "}\n";
}